

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O1

int ZPdr_ManDown(Pdr_Man_t *p,int k,Pdr_Set_t **ppCube,Pdr_Set_t *pPred,Hash_Int_t *keep,
                Pdr_Set_t *pIndCube,int *added)

{
  int *piVar1;
  Pdr_Set_t **ppPVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  Pdr_Set_t *pPVar6;
  long lVar7;
  Pdr_Set_t *pPVar8;
  byte bVar9;
  char *__function;
  uint uVar10;
  char *__file;
  uint uVar11;
  Pdr_Man_t *pPVar12;
  FILE *pFVar13;
  char *__assertion;
  uint k_00;
  ulong uVar14;
  bool bVar15;
  Pdr_Set_t *pCubeMin;
  Pdr_Set_t *local_70;
  Pdr_Set_t *local_68;
  int local_60;
  uint local_5c;
  ulong local_58;
  Pdr_Set_t **local_50;
  Hash_Int_t *local_48;
  Pdr_Set_t *local_40;
  ulong local_38;
  
  uVar14 = (ulong)(uint)k;
  local_5c = p->vSolvers->nSize - 1;
  local_60 = k + -1;
  local_38 = (ulong)(uint)-k;
  local_70 = pPred;
  local_58 = uVar14;
  local_50 = ppCube;
  local_48 = keep;
  local_40 = pIndCube;
  do {
    if (1 < (int)uVar14) {
      uVar10 = 0;
      iVar4 = 0;
      while( true ) {
        if (((iVar4 != 0) || (p->pPars->fCtgs == 0)) || (2 < uVar10)) goto LAB_005e1ff0;
        pPVar6 = Pdr_SetDup(local_70);
        iVar4 = Pdr_SetIsInit(pPVar6,-1);
        uVar3 = local_38;
        if (iVar4 != 0) break;
        if (*added == 0) {
          if (0 < (int)uVar14) {
            iVar4 = 1;
            do {
              Pdr_ManSolverAddClause(p,iVar4,pIndCube);
              iVar5 = (int)uVar3 + iVar4;
              iVar4 = iVar4 + 1;
            } while (iVar5 != 0);
          }
          *added = 1;
          uVar14 = local_58;
        }
        iVar4 = Pdr_ManCheckCube(p,local_60,pPVar6,(Pdr_Set_t **)0x0,p->pPars->nConfLimit,0,1);
        if (iVar4 != 1) break;
        local_68 = Pdr_ManReduceClause(p,local_60,pPVar6);
        if (local_68 == (Pdr_Set_t *)0x0) {
          local_68 = Pdr_SetDup(pPVar6);
        }
        pPVar8 = local_68;
        k_00 = (uint)uVar14;
        if ((int)k_00 < (int)local_5c) {
          uVar14 = uVar14 & 0xffffffff;
          do {
            k_00 = (uint)uVar14;
            iVar4 = Pdr_ManCheckCube(p,k_00,pPVar8,(Pdr_Set_t **)0x0,0,0,1);
            if (iVar4 == 0) break;
            k_00 = k_00 + 1;
            uVar14 = (ulong)k_00;
          } while (local_5c != k_00);
        }
        pPVar12 = p;
        iVar4 = ZPdr_ManSimpleMic(p,k_00 - 1,&local_68);
        if (iVar4 == -1) {
          __assert_fail("micResult != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCore.c"
                        ,0x19c,
                        "int ZPdr_ManDown(Pdr_Man_t *, int, Pdr_Set_t **, Pdr_Set_t *, Hash_Int_t *, Pdr_Set_t *, int *)"
                       );
        }
        if (p->pPars->fVeryVerbose != 0) {
          Abc_Print((int)pPVar12,"Adding cube ");
          pFVar13 = _stdout;
          Pdr_SetPrint(_stdout,local_68,p->pAig->nRegs,(Vec_Int_t *)0x0);
          Abc_Print((int)pFVar13," to frame %d.\n",(ulong)k_00);
        }
        pPVar8 = local_68;
        if (0 < local_68->nLits) {
          lVar7 = 0;
          do {
            uVar11 = *(uint *)(&local_68->field_0x14 + lVar7 * 4);
            if ((int)uVar11 < 0) {
              __assert_fail("pCubeMin->Lits[i] >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCore.c"
                            ,0x1a8,
                            "int ZPdr_ManDown(Pdr_Man_t *, int, Pdr_Set_t **, Pdr_Set_t *, Hash_Int_t *, Pdr_Set_t *, int *)"
                           );
            }
            if (p->pAig->nRegs <= (int)(uVar11 >> 1)) {
              __assertion = "(pCubeMin->Lits[i] / 2) < Aig_ManRegNum(p->pAig)";
              __file = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCore.c"
              ;
              __function = 
              "int ZPdr_ManDown(Pdr_Man_t *, int, Pdr_Set_t **, Pdr_Set_t *, Hash_Int_t *, Pdr_Set_t *, int *)"
              ;
LAB_005e2138:
              __assert_fail(__assertion,__file,0x1a9,__function);
            }
            iVar4 = p->vPrio->nSize;
            if (iVar4 <= (int)(uVar11 >> 1)) {
              __assertion = "i >= 0 && i < p->nSize";
              __file = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
              ;
              __function = "int Vec_IntEntry(Vec_Int_t *, int)";
              goto LAB_005e2138;
            }
            piVar1 = p->vPrio->pArray;
            bVar9 = (byte)p->nPrioShift;
            if (piVar1[uVar11 >> 1] >> (bVar9 & 0x1f) == 0) {
              p->nAbsFlops = p->nAbsFlops + 1;
            }
            if ((*(int *)(&local_68->field_0x14 + lVar7 * 4) < -1) ||
               (uVar11 = *(int *)(&local_68->field_0x14 + lVar7 * 4) / 2, iVar4 <= (int)uVar11)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            piVar1 = piVar1 + uVar11;
            *piVar1 = *piVar1 + (1 << (bVar9 & 0x1f));
            lVar7 = lVar7 + 1;
          } while (lVar7 < local_68->nLits);
        }
        Vec_VecPush(p->vClauses,k_00,local_68);
        p->nCubes = p->nCubes + 1;
        if (0 < (int)k_00) {
          uVar11 = 1;
          do {
            Pdr_ManSolverAddClause(p,uVar11,pPVar8);
            bVar15 = uVar11 != k_00;
            uVar11 = uVar11 + 1;
          } while (bVar15);
        }
        Pdr_SetDeref(local_70);
        uVar14 = local_58;
        iVar4 = Pdr_ManCheckCube(p,(int)local_58,*local_50,&local_70,p->pPars->nConfLimit,0,1);
        if (iVar4 < 0) {
          __assert_fail("RetValue >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCore.c"
                        ,0x1b6,
                        "int ZPdr_ManDown(Pdr_Man_t *, int, Pdr_Set_t **, Pdr_Set_t *, Hash_Int_t *, Pdr_Set_t *, int *)"
                       );
        }
        uVar10 = uVar10 + 1;
        Pdr_SetDeref(pPVar6);
        pIndCube = local_40;
        if (iVar4 == 1) {
          return 1;
        }
      }
      Pdr_SetDeref(pPVar6);
    }
LAB_005e1ff0:
    ppPVar2 = local_50;
    if (p->pPars->fVeryVerbose != 0) {
      puts("Cube:");
      ZPdr_SetPrint(*ppPVar2);
      puts("\nPred:");
      ZPdr_SetPrint(local_70);
    }
    pPVar6 = *ppPVar2;
    pPVar8 = ZPdr_SetIntersection(pPVar6,local_70,local_48);
    *ppPVar2 = pPVar8;
    Pdr_SetDeref(pPVar6);
    Pdr_SetDeref(local_70);
    uVar14 = local_58;
    if (*ppPVar2 == (Pdr_Set_t *)0x0) {
      return 0;
    }
    if (p->pPars->fVeryVerbose != 0) {
      puts("Intersection:");
      ZPdr_SetPrint(*ppPVar2);
    }
    iVar4 = Pdr_SetIsInit(*ppPVar2,-1);
    if (iVar4 != 0) {
      if (p->pPars->fVeryVerbose != 0) {
        puts("Failed initiation");
        return 0;
      }
      return 0;
    }
    iVar4 = Pdr_ManCheckCube(p,(int)uVar14,*ppPVar2,&local_70,p->pPars->nConfLimit,0,1);
    if (iVar4 != 0) {
      if (iVar4 != -1) {
        return 1;
      }
      return -1;
    }
    if ((*ppPVar2)->nLits == 1) {
      Pdr_SetDeref(local_70);
      return 0;
    }
  } while( true );
}

Assistant:

int ZPdr_ManDown( Pdr_Man_t * p, int k, Pdr_Set_t ** ppCube, Pdr_Set_t * pPred, Hash_Int_t * keep, Pdr_Set_t * pIndCube, int * added )
{
    int RetValue = 0, CtgRetValue, i, ctgAttempts, l, micResult;
    int kMax = Vec_PtrSize(p->vSolvers)-1;
    Pdr_Set_t * pCubeTmp, * pCubeMin, * pCtg;
    while ( RetValue == 0 )
    {
        ctgAttempts = 0;
        while ( p->pPars->fCtgs && RetValue == 0 && k > 1 && ctgAttempts < 3 )
        {
            pCtg = Pdr_SetDup( pPred );
            //Check CTG for inductiveness
            if ( Pdr_SetIsInit( pCtg, -1 ) )
            {
                Pdr_SetDeref( pCtg );
                break;
            }
            if (*added == 0)
            {
                for ( i = 1; i <= k; i++ )
                    Pdr_ManSolverAddClause( p, i, pIndCube);
                *added = 1;
            }
            ctgAttempts++;
            CtgRetValue = Pdr_ManCheckCube( p, k-1, pCtg, NULL, p->pPars->nConfLimit, 0, 1 );
            if ( CtgRetValue != 1 )
            {
                Pdr_SetDeref( pCtg );
                break;
            }
            pCubeMin = Pdr_ManReduceClause( p, k-1, pCtg );
            if ( pCubeMin == NULL )
                pCubeMin = Pdr_SetDup ( pCtg );

            for ( l = k; l < kMax; l++ )
                if ( !Pdr_ManCheckCube( p, l, pCubeMin, NULL, 0, 0, 1 ) )
                    break;
            micResult = ZPdr_ManSimpleMic( p, l-1, &pCubeMin );
            assert ( micResult != -1 );

            // add new clause
            if ( p->pPars->fVeryVerbose )
            {
                Abc_Print( 1, "Adding cube " );
                Pdr_SetPrint( stdout, pCubeMin, Aig_ManRegNum(p->pAig), NULL );
                Abc_Print( 1, " to frame %d.\n", l );
            }
            // set priority flops
            for ( i = 0; i < pCubeMin->nLits; i++ )
            {
                assert( pCubeMin->Lits[i] >= 0 );
                assert( (pCubeMin->Lits[i] / 2) < Aig_ManRegNum(p->pAig) );
                if ( (Vec_IntEntry(p->vPrio, pCubeMin->Lits[i] / 2) >> p->nPrioShift) == 0 )
                    p->nAbsFlops++;
                Vec_IntAddToEntry( p->vPrio, pCubeMin->Lits[i] / 2, 1 << p->nPrioShift );
            }

            Vec_VecPush( p->vClauses, l, pCubeMin );   // consume ref
            p->nCubes++;
            // add clause
            for ( i = 1; i <= l; i++ )
                Pdr_ManSolverAddClause( p, i, pCubeMin );
            Pdr_SetDeref( pPred );
            RetValue = Pdr_ManCheckCube( p, k, *ppCube, &pPred, p->pPars->nConfLimit, 0, 1 );
            assert( RetValue >= 0 );
            Pdr_SetDeref( pCtg );
            if ( RetValue == 1 )
            {
                //printf ("IT'S A ONE\n");
                return 1;
            }
        }

        //join
        if ( p->pPars->fVeryVerbose )
        {
            printf("Cube:\n");
            ZPdr_SetPrint( *ppCube );
            printf("\nPred:\n");
            ZPdr_SetPrint( pPred );
        }
        *ppCube = ZPdr_SetIntersection( pCubeTmp = *ppCube, pPred, keep );
        Pdr_SetDeref( pCubeTmp );
        Pdr_SetDeref( pPred );
        if ( *ppCube == NULL )
            return 0;
        if ( p->pPars->fVeryVerbose )
        {
            printf("Intersection:\n");
            ZPdr_SetPrint( *ppCube );
        }
        if ( Pdr_SetIsInit( *ppCube, -1 ) )
        {
            if ( p->pPars->fVeryVerbose )
                printf ("Failed initiation\n");
            return 0;
        }
        RetValue = Pdr_ManCheckCube( p, k, *ppCube, &pPred, p->pPars->nConfLimit, 0, 1 );
        if ( RetValue == -1 )
            return -1;
        if ( RetValue == 1 )
        {
            //printf ("*********IT'S A ONE\n");
            break;
        }
        if ( RetValue == 0 && (*ppCube)->nLits == 1)
        {
            Pdr_SetDeref( pPred ); // fixed memory leak
            // A workaround for the incomplete assignment returned by the SAT
            // solver
            return 0;
        }
    }
    return 1;
}